

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_state_opcode_returns_instruction_Test::TestBody
          (CpuTest_state_opcode_returns_instruction_Test *this)

{
  bool bVar1;
  int iVar2;
  MockSpec<unsigned_char_(unsigned_short)> *this_00;
  pointer pIVar3;
  undefined4 extraout_var;
  char *pcVar4;
  Opcode *pOVar5;
  undefined4 extraout_var_00;
  char *in_R9;
  AssertHelper local_268;
  Message local_260;
  uint local_254;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_8;
  Message local_238;
  int local_22c;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_7;
  Message local_210;
  uint local_204;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_6;
  CpuState next_state;
  Message local_1c0;
  AddressMode local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_5;
  Message local_198;
  Family local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_4;
  Message local_170;
  Instruction local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_130;
  Message local_128;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_;
  Message local_100;
  uint local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  Message local_b0;
  uint local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  optional<n_e_s::core::Opcode> opcode;
  CpuState state;
  Matcher<unsigned_short> local_48;
  MockSpec<unsigned_char_(unsigned_short)> local_30;
  CpuTest_state_opcode_returns_instruction_Test *local_10;
  CpuTest_state_opcode_returns_instruction_Test *this_local;
  
  (this->super_CpuTest).registers.pc = 0x1234;
  local_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,'\b');
  testing::Matcher<unsigned_short>::Matcher(&local_48,0x1235);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_30,&(this->super_CpuTest).mmu.super_MockMmu,&local_48);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                      (&local_30,(WithoutMatchers *)((long)&state.cycle + 3),(void *)0x0);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
             ,0x38,"mmu","read_byte(0x1235)");
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_30);
  testing::Matcher<unsigned_short>::~Matcher(&local_48);
  n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x01');
  pIVar3 = std::unique_ptr<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>::
           operator->(&(this->super_CpuTest).cpu);
  iVar2 = (*(pIVar3->super_ICpu)._vptr_ICpu[4])();
  memcpy((void *)((long)&opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
                         super__Optional_payload_base<n_e_s::core::Opcode>._M_payload + 8),
         (void *)CONCAT44(extraout_var,iVar2),0x28);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
           super__Optional_payload_base<n_e_s::core::Opcode>._8_8_;
  opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._0_8_ =
       state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
       super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._0_8_;
  local_a4 = 0;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_a0,"0u","state.start_cycle",&local_a4,
             (unsigned_long *)&state.start_pc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x3e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  local_cc = 0x1234;
  testing::internal::EqHelper::Compare<int,_unsigned_short,_nullptr>
            ((EqHelper *)local_c8,"0x1234","state.start_pc",&local_cc,
             (unsigned_short *)
             &state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
              super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._M_value.address_mode);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x3f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  local_f4 = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_f0,"1u","state.cycle",&local_f4,&state.start_cycle);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x40,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_119 = std::optional<n_e_s::core::Opcode>::has_value
                        ((optional<n_e_s::core::Opcode> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_118,(AssertionResult *)0x303281,
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_3.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x42,pcVar4);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_161 = PhpImplied;
  pOVar5 = std::optional<n_e_s::core::Opcode>::operator->
                     ((optional<n_e_s::core::Opcode> *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<n_e_s::core::Instruction,_n_e_s::core::Instruction,_nullptr>
            ((EqHelper *)local_160,"Instruction::PhpImplied","opcode->instruction",&local_161,
             &pOVar5->instruction);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x43,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  local_18c = PHP;
  pOVar5 = std::optional<n_e_s::core::Opcode>::operator->
                     ((optional<n_e_s::core::Opcode> *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<n_e_s::core::Family,_n_e_s::core::Family,_nullptr>
            ((EqHelper *)local_188,"Family::PHP","opcode->family",&local_18c,&pOVar5->family);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x44,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  local_1b4 = Implied;
  pOVar5 = std::optional<n_e_s::core::Opcode>::operator->
                     ((optional<n_e_s::core::Opcode> *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<n_e_s::core::AddressMode,_n_e_s::core::AddressMode,_nullptr>
            ((EqHelper *)local_1b0,"AddressMode::Implied","opcode->address_mode",&local_1b4,
             &pOVar5->address_mode);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&next_state.cycle,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x45,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&next_state.cycle,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&next_state.cycle);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x01');
  pIVar3 = std::unique_ptr<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>::
           operator->(&(this->super_CpuTest).cpu);
  iVar2 = (*(pIVar3->super_ICpu)._vptr_ICpu[4])();
  memcpy(&gtest_ar_6.message_,(void *)CONCAT44(extraout_var_00,iVar2),0x28);
  local_204 = 0;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_200,"0u","next_state.start_cycle",&local_204,
             (unsigned_long *)&next_state.start_pc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x4a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  local_22c = 0x1234;
  testing::internal::EqHelper::Compare<int,_unsigned_short,_nullptr>
            ((EqHelper *)local_228,"0x1234","next_state.start_pc",&local_22c,
             (unsigned_short *)
             &next_state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>.
              _M_payload.super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._M_value.
              address_mode);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x4b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  local_254 = 2;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_250,"2u","next_state.cycle",&local_254,&next_state.start_cycle);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x4c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  return;
}

Assistant:

TEST_F(CpuTest, state_opcode_returns_instruction) {
    registers.pc = 0x1234;
    stage_instruction(PHP);
    // Dummy read
    EXPECT_CALL(mmu, read_byte(0x1235));
    step_execution(1);

    const CpuState state = cpu->state();
    const auto opcode = state.current_opcode;

    EXPECT_EQ(0u, state.start_cycle);
    EXPECT_EQ(0x1234, state.start_pc);
    EXPECT_EQ(1u, state.cycle);

    EXPECT_TRUE(opcode.has_value());
    EXPECT_EQ(Instruction::PhpImplied, opcode->instruction);
    EXPECT_EQ(Family::PHP, opcode->family);
    EXPECT_EQ(AddressMode::Implied, opcode->address_mode);

    // Only cycle should change
    step_execution(1);
    const CpuState next_state = cpu->state();
    EXPECT_EQ(0u, next_state.start_cycle);
    EXPECT_EQ(0x1234, next_state.start_pc);
    EXPECT_EQ(2u, next_state.cycle);
}